

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

int alsa_stream_stop(cubeb_stream_conflict1 *stm)

{
  cubeb_conflict1 *pcVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  
  if (stm == (cubeb_stream_conflict1 *)0x0) {
    __assert_fail("stm",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x52e,"int alsa_stream_stop(cubeb_stream *)");
  }
  pcVar1 = stm->context;
  if ((stm->stream_type == SND_PCM_STREAM_PLAYBACK) &&
     (stm->other_stream != (cubeb_stream_conflict1 *)0x0)) {
    alsa_stream_stop(stm->other_stream);
  }
  __mutex = &pcVar1->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  do {
    if (stm->state != PROCESSING) {
      alsa_set_stream_state(stm,INACTIVE);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_mutex_lock((pthread_mutex_t *)&stm->mutex);
      (*cubeb_snd_pcm_pause)(stm->pcm,1);
      pthread_mutex_unlock((pthread_mutex_t *)&stm->mutex);
      return 0;
    }
    iVar2 = pthread_cond_wait((pthread_cond_t *)&stm->cond,(pthread_mutex_t *)__mutex);
  } while (iVar2 == 0);
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                ,0x53a,"int alsa_stream_stop(cubeb_stream *)");
}

Assistant:

static int
alsa_stream_stop(cubeb_stream * stm)
{
  cubeb * ctx;
  int r;

  assert(stm);
  ctx = stm->context;

  if (stm->stream_type == SND_PCM_STREAM_PLAYBACK && stm->other_stream) {
    int r = alsa_stream_stop(stm->other_stream);
    if (r != CUBEB_OK)
      return r;
  }

  pthread_mutex_lock(&ctx->mutex);
  while (stm->state == PROCESSING) {
    r = pthread_cond_wait(&stm->cond, &ctx->mutex);
    assert(r == 0);
  }

  alsa_set_stream_state(stm, INACTIVE);
  pthread_mutex_unlock(&ctx->mutex);

  pthread_mutex_lock(&stm->mutex);
  WRAP(snd_pcm_pause)(stm->pcm, 1);
  pthread_mutex_unlock(&stm->mutex);

  return CUBEB_OK;
}